

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined7 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  byte bVar5;
  char *pcVar6;
  pair<bool,_const_char_*> pVar7;
  
  pcVar6 = lhs;
  if (lhs == (char *)0x0) {
    pcVar6 = rhs;
  }
  pVar7._1_7_ = (int7)((ulong)in_RAX >> 8);
  pVar7.first = true;
  pVar7.second = pcVar6;
  if (lhs != (char *)0x0 && rhs != (char *)0x0) {
    if (t - NumberMinType < 2) {
      pVar7 = consistentNumberProperty(lhs,rhs,t);
    }
    else {
      if (t == StringType) {
        iVar3 = strcmp(lhs,rhs);
        bVar1 = iVar3 == 0;
        uVar4 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar3) >> 8),bVar1);
      }
      else {
        if (t != BoolType) {
          __assert_fail("false && \"Unreachable!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                        ,0x17c1,
                        "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                       );
        }
        bVar1 = cmValue::IsOn(lhs);
        bVar2 = cmValue::IsOn(rhs);
        uVar4 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
        bVar5 = (byte)uVar4 ^ bVar1;
        uVar4 = CONCAT71((int7)(uVar4 >> 8),bVar5) ^ 1;
        bVar1 = bVar5 == 0;
      }
      pVar7.second = (char *)0x0;
      pVar7._0_8_ = uVar4;
      if (bVar1) {
        pVar7.second = lhs;
      }
    }
  }
  return pVar7;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char* lhs,
                                                const char* rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs) {
    return { true, lhs };
  }
  if (!lhs) {
    return { true, rhs };
  }
  if (!rhs) {
    return { true, lhs };
  }

  switch (t) {
    case BoolType: {
      bool same = cmIsOn(lhs) == cmIsOn(rhs);
      return { same, same ? lhs : nullptr };
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType:
      return consistentNumberProperty(lhs, rhs, t);
  }
  assert(false && "Unreachable!");
  return { false, nullptr };
}